

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlChar xVar4;
  xmlChar *pxVar5;
  charactersSAXFunc p_Var6;
  __int32_t *p_Var7;
  endDocumentSAXFunc p_Var8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  _xmlSAXHandler *p_Var12;
  __int32_t **pp_Var13;
  xmlParserInputPtr pxVar14;
  xmlDtdPtr pxVar15;
  xmlChar *pxVar16;
  undefined8 in_R8;
  size_t extraLen;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    return 0x73;
  }
  pxVar14 = ctxt->input;
  if (pxVar14 == (xmlParserInputPtr)0x0) {
    return 0x73;
  }
  if (size < 0 || pxVar14->buf == (xmlParserInputBufferPtr)0x0) {
    return 0x73;
  }
  extraLen = CONCAT71((int7)((ulong)in_R8 >> 8),size != 0);
  if (chunk == (char *)0x0 && size != 0) {
    return 0x73;
  }
  if (ctxt->disableSAX < 2) {
    if (size != 0) {
      pxVar16 = pxVar14->cur;
      pxVar5 = pxVar14->base;
      iVar9 = xmlParserInputBufferPush(pxVar14->buf,size,chunk);
      xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar16 - (long)pxVar5);
      if (iVar9 < 0) {
        htmlParseErr(ctxt,ctxt->input->buf->error,"xmlParserInputBufferPush failed",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_00162a91;
      }
    }
LAB_00162536:
    while( true ) {
      if ((1 < ctxt->disableSAX) || (pxVar14 = ctxt->input, pxVar14 == (xmlParserInputPtr)0x0))
      goto switchD_00162574_caseD_ffffffff;
      if ((uint)(ctxt->instate + XML_PARSER_MISC) < 0x13) break;
switchD_00162574_caseD_2:
      extraLen = 0;
      htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error\n",(xmlChar *)0x0,(xmlChar *)0x0
                  );
      ctxt->instate = XML_PARSER_EOF;
    }
    pxVar16 = pxVar14->cur;
    uVar11 = (long)pxVar14->end - (long)pxVar16;
    switch(ctxt->instate) {
    case XML_PARSER_START:
      if ((terminate == 0) && (uVar11 < 4)) break;
      xmlDetectEncoding(ctxt);
      if (((ctxt->input->flags & 1) == 0) &&
         (iVar9 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar9 == 0)) {
        xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
      }
    case XML_PARSER_XML_DECL:
      p_Var12 = ctxt->sax;
      if (p_Var12 != (_xmlSAXHandler *)0x0) {
        if (p_Var12->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
          (*p_Var12->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
          p_Var12 = ctxt->sax;
          if (p_Var12 == (_xmlSAXHandler *)0x0) goto LAB_001626d7;
        }
        if ((p_Var12->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
          (*p_Var12->startDocument)(ctxt->userData);
        }
      }
LAB_001626d7:
      if ((ctxt->instate == XML_PARSER_XML_DECL) || (ctxt->instate == XML_PARSER_START)) {
        ctxt->instate = XML_PARSER_MISC;
      }
      goto LAB_00162536;
    case XML_PARSER_MISC:
    case XML_PARSER_PROLOG:
      htmlSkipBlankChars(ctxt);
      pxVar16 = pxVar14->cur;
      uVar11 = (long)pxVar14->end - (long)pxVar16;
      goto switchD_00162574_caseD_7;
    default:
      goto switchD_00162574_caseD_2;
    case XML_PARSER_START_TAG:
      if ((terminate != 0) || (iVar9 = htmlParseLookupGt(ctxt), -1 < iVar9)) {
        htmlParseElementInternal(ctxt);
        goto LAB_00162648;
      }
      break;
    case XML_PARSER_CONTENT:
      goto switchD_00162574_caseD_7;
    case XML_PARSER_END_TAG:
      if ((terminate == 0) && (iVar9 = htmlParseLookupGt(ctxt), iVar9 < 0)) break;
      htmlParseEndTag(ctxt);
      ctxt->instate = XML_PARSER_CONTENT;
      ctxt->checkIndex = 0;
      goto LAB_00162536;
    case XML_PARSER_EOF:
      goto switchD_00162574_caseD_ffffffff;
    }
  }
LAB_00162a91:
  return ctxt->errNo;
switchD_00162574_caseD_7:
  if (uVar11 == 0) goto switchD_00162574_caseD_ffffffff;
  if (ctxt->endCheckState == 0) {
    if (*pxVar16 != '<') {
      ctxt->instate = XML_PARSER_CONTENT;
      if (((terminate != 0) || (999 < uVar11)) ||
         (iVar9 = htmlParseLookupString(ctxt,0,"<",1,extraLen), -1 < iVar9)) {
        ctxt->checkIndex = 0;
        goto LAB_00162766;
      }
      goto LAB_00162a91;
    }
    if (uVar11 == 1) {
      if (terminate == 0) goto LAB_00162a91;
LAB_001625ba:
      ctxt->instate = XML_PARSER_CONTENT;
      htmlStartCharData(ctxt);
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
         (p_Var6 = ctxt->sax->characters, p_Var6 != (charactersSAXFunc)0x0)) {
        (*p_Var6)(ctxt->userData,"<",1);
      }
      pxVar14 = ctxt->input;
      ppxVar1 = &pxVar14->cur;
      *ppxVar1 = *ppxVar1 + 1;
      piVar2 = &pxVar14->col;
      *piVar2 = *piVar2 + 1;
      goto LAB_00162536;
    }
    bVar3 = pxVar16[1];
    if (bVar3 == 0x3f) {
      if ((terminate == 0) && (iVar9 = htmlParseLookupString(ctxt,2,">",1,extraLen), iVar9 < 0))
      goto LAB_00162a91;
      pxVar14 = ctxt->input;
      ppxVar1 = &pxVar14->cur;
      *ppxVar1 = *ppxVar1 + 1;
      piVar2 = &pxVar14->col;
      *piVar2 = *piVar2 + 1;
    }
    else {
      if (bVar3 == 0x2f) {
        ctxt->instate = XML_PARSER_END_TAG;
        ctxt->checkIndex = 0;
        goto LAB_00162536;
      }
      if (bVar3 != 0x21) {
        if (0x19 < (bVar3 | 0x20) - 0x61) goto LAB_001625ba;
        ctxt->instate = XML_PARSER_START_TAG;
        ctxt->checkIndex = 0;
        goto LAB_00162536;
      }
      if ((terminate == 0) && (uVar11 < 4)) goto LAB_00162a91;
      if ((pxVar16[2] == '-') && (pxVar16[3] == '-')) {
        if (terminate == 0) {
          while( true ) {
            uVar10 = htmlParseLookupString(ctxt,2,"--",2,extraLen);
            if ((int)uVar10 < 0) goto switchD_00162574_caseD_ffffffff;
            pxVar14 = ctxt->input;
            pxVar16 = pxVar14->cur;
            uVar11 = (ulong)uVar10;
            xVar4 = pxVar16[uVar11 + 2];
            if ((xVar4 == '>') || (((3 < uVar10 && (xVar4 == '!')) && (pxVar16[uVar11 + 3] == '>')))
               ) break;
            extraLen = (size_t)(xVar4 == '!');
            if ((long)pxVar14->end - (long)pxVar16 <= (long)(ulong)(uVar10 + (xVar4 == '!') + 2)) {
              ctxt->checkIndex = uVar11;
              goto switchD_00162574_caseD_ffffffff;
            }
            ctxt->checkIndex = (ulong)(uVar10 + 1);
          }
          ctxt->checkIndex = 0;
        }
        else {
          pxVar14 = ctxt->input;
          pxVar16 = pxVar14->cur;
        }
        pxVar14->cur = pxVar16 + 4;
        pxVar14->col = pxVar14->col + 4;
        htmlParseComment(ctxt,0);
        goto LAB_00162536;
      }
      if ((terminate == 0) && (uVar11 < 9)) goto LAB_00162a91;
      pp_Var13 = __ctype_toupper_loc();
      p_Var7 = *pp_Var13;
      pxVar14 = ctxt->input;
      pxVar16 = pxVar14->cur;
      if ((((p_Var7[pxVar16[2]] == 0x44) &&
           (((p_Var7[pxVar16[3]] == 0x4f && (p_Var7[pxVar16[4]] == 0x43)) &&
            (p_Var7[pxVar16[5]] == 0x54)))) &&
          ((p_Var7[pxVar16[6]] == 0x59 && (p_Var7[pxVar16[7]] == 0x50)))) &&
         (p_Var7[pxVar16[8]] == 0x45)) {
        if ((terminate == 0) && (iVar9 = htmlParseLookupString(ctxt,9,">",1,extraLen), iVar9 < 0))
        goto LAB_00162a91;
        htmlParseDocTypeDecl(ctxt);
        if (ctxt->instate == XML_PARSER_MISC) {
          ctxt->instate = XML_PARSER_PROLOG;
        }
        else {
LAB_00162648:
          ctxt->instate = XML_PARSER_CONTENT;
        }
        goto LAB_00162536;
      }
      ctxt->instate = XML_PARSER_CONTENT;
      if (terminate == 0) {
        iVar9 = htmlParseLookupString(ctxt,2,">",1,extraLen);
        if (iVar9 < 0) goto LAB_00162a91;
        pxVar14 = ctxt->input;
        pxVar16 = pxVar14->cur;
      }
      pxVar14->cur = pxVar16 + 2;
      pxVar14->col = pxVar14->col + 2;
    }
    htmlParseComment(ctxt,1);
    goto LAB_00162536;
  }
LAB_00162766:
  iVar9 = htmlParseCharData(ctxt,(uint)(terminate == 0));
  if (iVar9 == 0) goto switchD_00162574_caseD_ffffffff;
  goto LAB_00162536;
switchD_00162574_caseD_ffffffff:
  if ((terminate != 0) && (ctxt->instate != XML_PARSER_EOF)) {
    htmlAutoCloseOnEnd(ctxt);
    xmlParserCheckEOF(ctxt,XML_ERR_INTERNAL_ERROR);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
      (*p_Var8)(ctxt->userData);
    }
    if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
       (pxVar15 = xmlGetIntSubset(ctxt->myDoc), pxVar15 == (xmlDtdPtr)0x0)) {
      pxVar15 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                   (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                   (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar15;
      if (pxVar15 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  goto LAB_00162a91;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) ||
        (ctxt->input == NULL) || (ctxt->input->buf == NULL) ||
        (size < 0) ||
        ((size > 0) && (chunk == NULL)))
	return(XML_ERR_ARGUMENT);
    if (PARSER_STOPPED(ctxt) != 0)
        return(ctxt->errNo);

    if (size > 0)  {
	size_t pos = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
	if (res < 0) {
            htmlParseErr(ctxt, ctxt->input->buf->error,
                         "xmlParserInputBufferPush failed", NULL, NULL);
            xmlHaltParser(ctxt);
	    return (ctxt->errNo);
	}
    }

    htmlParseTryOrFinish(ctxt, terminate);

    if ((terminate) && (ctxt->instate != XML_PARSER_EOF)) {
        htmlAutoCloseOnEnd(ctxt);

        /*
         * Only check for truncated multi-byte sequences
         */
        xmlParserCheckEOF(ctxt, XML_ERR_INTERNAL_ERROR);

        if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
            ctxt->sax->endDocument(ctxt->userData);

        if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) &&
            (ctxt->myDoc != NULL)) {
            xmlDtdPtr dtd;
            dtd = xmlGetIntSubset(ctxt->myDoc);
            if (dtd == NULL) {
                ctxt->myDoc->intSubset =
                    xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
                        BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
                        BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
                if (ctxt->myDoc->intSubset == NULL)
                    htmlErrMemory(ctxt);
            }
        }

	ctxt->instate = XML_PARSER_EOF;
    }

    return((xmlParserErrors) ctxt->errNo);
}